

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e1.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  istream *piVar2;
  ostream *this;
  ostream *poVar3;
  int m;
  int d;
  uint local_24;
  int local_20;
  int local_1c;
  
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_20);
  piVar2 = (istream *)std::istream::operator>>(piVar2,(int *)&local_24);
  std::istream::operator>>(piVar2,&local_1c);
  lVar1 = std::cout;
  local_24 = local_24 + local_1c;
  if (0x3b < (int)local_24) {
    local_20 = local_20 + local_24 / 0x3c;
    local_24 = local_24 % 0x3c;
  }
  local_20 = local_20 +
             (((uint)(local_20 / 6 + (local_20 >> 0x1f)) >> 2) - (local_20 >> 0x1f)) * -0x18;
  *(undefined8 *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  if (*(char *)(lVar1 + 0x105109) == '\0') {
    std::ios::widen((char)lVar1 + '(');
    *(undefined1 *)(lVar1 + 0x105109) = 1;
  }
  *(undefined1 *)(lVar1 + 0x105108) = 0x30;
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_20);
  std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
  lVar1 = *(long *)this;
  *(undefined8 *)(this + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = this + lVar1;
  if (this[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  poVar3 = (ostream *)std::ostream::operator<<(this,local_24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return 0;
}

Assistant:

int main() {
    int h, m, d;
    cin >> h >> m >> d;
    m += d;
    if (m >= 60) {
        h += (m / 60);
        m %= 60;
    }
    h %= 24;
    cout << setw(2) << setfill('0') << h << " " << setw(2) << setfill('0') << m
         << "\n";
}